

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

int uv_try_write2(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle)

{
  int err;
  uv_stream_t *send_handle_local;
  uint nbufs_local;
  uv_buf_t *bufs_local;
  uv_stream_t *stream_local;
  
  if ((stream->connect_req == (uv_connect_t *)0x0) && (stream->write_queue_size == 0)) {
    stream_local._4_4_ = uv__check_before_write(stream,nbufs,(uv_stream_t *)0x0);
    if (-1 < stream_local._4_4_) {
      stream_local._4_4_ = uv__try_write(stream,bufs,nbufs,send_handle);
    }
  }
  else {
    stream_local._4_4_ = -0xb;
  }
  return stream_local._4_4_;
}

Assistant:

int uv_try_write2(uv_stream_t* stream,
                  const uv_buf_t bufs[],
                  unsigned int nbufs,
                  uv_stream_t* send_handle) {
  int err;

  /* Connecting or already writing some data */
  if (stream->connect_req != NULL || stream->write_queue_size != 0)
    return UV_EAGAIN;

  err = uv__check_before_write(stream, nbufs, NULL);
  if (err < 0)
    return err;

  return uv__try_write(stream, bufs, nbufs, send_handle);
}